

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
TOICompactRewardDecPOMDPDiscrete::~TOICompactRewardDecPOMDPDiscrete
          (TOICompactRewardDecPOMDPDiscrete *this,void **vtt)

{
  void *pvVar1;
  pointer ppRVar2;
  RewardModel *pRVar3;
  uint uVar4;
  
  pvVar1 = *vtt;
  uVar4 = 0;
  *(void **)&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
             super_MultiAgentDecisionProcess = pvVar1;
  *(void **)(&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
              super_MultiAgentDecisionProcess.field_0x0 + *(long *)((long)pvVar1 + -0x50)) =
       vtt[0x11];
  *(void **)(&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                super_TransitionObservationIndependentMADPDiscrete.
                                super_MultiAgentDecisionProcess + -0x58)) = vtt[0x12];
  *(void **)(&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                super_TransitionObservationIndependentMADPDiscrete.
                                super_MultiAgentDecisionProcess + -0x60)) = vtt[0x13];
  *(void **)(&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                super_TransitionObservationIndependentMADPDiscrete.
                                super_MultiAgentDecisionProcess + -0x40)) = vtt[0x14];
  *(void **)(&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                super_TransitionObservationIndependentMADPDiscrete.
                                super_MultiAgentDecisionProcess + -0x48)) = vtt[0x15];
  *(void **)&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
             field_0x280 = vtt[0x16];
  while( true ) {
    ppRVar2 = (this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar2 >> 3 == (ulong)uVar4)
    break;
    pRVar3 = ppRVar2[uVar4];
    if (pRVar3 != (RewardModel *)0x0) {
      (*(pRVar3->super_RewardModelDiscreteInterface).super_QTableInterface._vptr_QTableInterface[3])
                ();
    }
    uVar4 = uVar4 + 1;
  }
  std::_Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>::~_Vector_base
            (&(this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_nrTwoAgentActions).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
             &(this->super_TOIDecPOMDPDiscrete).field_0x2c0);
  TOIDecPOMDPDiscrete::~TOIDecPOMDPDiscrete(&this->super_TOIDecPOMDPDiscrete,vtt + 1);
  return;
}

Assistant:

TOICompactRewardDecPOMDPDiscrete::~TOICompactRewardDecPOMDPDiscrete()
{
    for(unsigned int i=0;i!=_m_p_rModels.size();++i)
        delete(_m_p_rModels[i]);
}